

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

Option * __thiscall
CLI::App::set_config
          (App *this,string *option_name,string *default_filename,string *help_message,
          bool config_required)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  MultiOptionPolicy MVar2;
  pointer pcVar3;
  Option *pOVar4;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this->config_ptr_ != (Option *)0x0) {
    remove_option(this,this->config_ptr_);
    this->config_ptr_ = (Option *)0x0;
  }
  if (option_name->_M_string_length == 0) {
    pOVar4 = (Option *)0x0;
  }
  else {
    pcVar3 = (option_name->_M_dataplus)._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar3,pcVar3 + option_name->_M_string_length);
    pOVar4 = add_option<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                       (this,&local_70,help_message);
    this->config_ptr_ = pOVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      pOVar4 = this->config_ptr_;
    }
    if (config_required) {
      (pOVar4->super_OptionBase<CLI::Option>).required_ = true;
    }
    local_50._M_string_length = default_filename->_M_string_length;
    if (local_50._M_string_length != 0) {
      local_50._M_dataplus._M_p = (default_filename->_M_dataplus)._M_p;
      paVar1 = &default_filename->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == paVar1) {
        local_50.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_50.field_2._8_8_ = *(undefined8 *)((long)&default_filename->field_2 + 8);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      }
      else {
        local_50.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      }
      (default_filename->_M_dataplus)._M_p = (pointer)paVar1;
      default_filename->_M_string_length = 0;
      (default_filename->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&pOVar4->default_str_,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      pOVar4 = this->config_ptr_;
      pOVar4->force_callback_ = true;
    }
    (pOVar4->super_OptionBase<CLI::Option>).configurable_ = false;
    MVar2 = (pOVar4->super_OptionBase<CLI::Option>).multi_option_policy_;
    if (MVar2 != Reverse) {
      if (((MVar2 == Throw) && (pOVar4->expected_max_ == 0x20000000)) && (1 < pOVar4->expected_min_)
         ) {
        pOVar4->expected_max_ = pOVar4->expected_min_;
      }
      (pOVar4->super_OptionBase<CLI::Option>).multi_option_policy_ = Reverse;
      pOVar4->current_option_state_ = parsing;
    }
  }
  return pOVar4;
}

Assistant:

CLI11_INLINE Option *App::set_config(std::string option_name,
                                     std::string default_filename,
                                     const std::string &help_message,
                                     bool config_required) {

    // Remove existing config if present
    if(config_ptr_ != nullptr) {
        remove_option(config_ptr_);
        config_ptr_ = nullptr;  // need to remove the config_ptr completely
    }

    // Only add config if option passed
    if(!option_name.empty()) {
        config_ptr_ = add_option(option_name, help_message);
        if(config_required) {
            config_ptr_->required();
        }
        if(!default_filename.empty()) {
            config_ptr_->default_str(std::move(default_filename));
            config_ptr_->force_callback_ = true;
        }
        config_ptr_->configurable(false);
        // set the option to take the last value and reverse given by default
        config_ptr_->multi_option_policy(MultiOptionPolicy::Reverse);
    }

    return config_ptr_;
}